

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.cpp
# Opt level: O3

void __thiscall
Trie<char,26ul,(char)97>::add<std::__cxx11::string>
          (Trie<char,26ul,(char)97> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *word)

{
  size_type sVar1;
  char cVar2;
  Trie<char,26ul,(char)97> *__s;
  char *pcVar3;
  
  pcVar3 = (word->_M_dataplus)._M_p;
  cVar2 = *pcVar3;
  if (cVar2 != '\0') {
    sVar1 = word->_M_string_length;
    do {
      if (pcVar3 == (word->_M_dataplus)._M_p + sVar1) break;
      __s = *(Trie<char,26ul,(char)97> **)(this + (long)cVar2 * 8 + -0x308);
      if (*(Trie<char,26ul,(char)97> **)(this + (long)cVar2 * 8 + -0x308) ==
          (Trie<char,26ul,(char)97> *)0x0) {
        __s = (Trie<char,26ul,(char)97> *)operator_new(0xd8);
        memset(__s,0,0xd8);
        *(Trie<char,26ul,(char)97> **)(this + (long)cVar2 * 8 + -0x308) = __s;
      }
      this = __s;
      cVar2 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  *(long *)(this + 0xd0) = *(long *)(this + 0xd0) + 1;
  return;
}

Assistant:

void add(const Iteratable& word) {
    auto root = this;
    for (auto c = std::cbegin(word); *c and c != std::cend(word); ++c) {
      auto index = *c - offset;
      if (root->nodes[index] == nullptr) {
        root->nodes[index] = new Trie<Element, N, offset>();
      }
      root = root->nodes[index];
    }
    root->counter += 1;
  }